

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O2

pair<const_char_*,_const_char_*> __thiscall luna::VM::GetOperandNameAndScope(VM *this,Value *a)

{
  uint uVar1;
  State *pSVar2;
  _List_node_base *p_Var3;
  Closure *this_00;
  Function *this_01;
  Instruction *pIVar4;
  String *pSVar5;
  Value *pVVar6;
  ulong uVar7;
  char *pcVar8;
  Instruction *pIVar9;
  uint uVar10;
  char *pcVar11;
  ulong uVar12;
  pair<const_char_*,_const_char_*> pVar13;
  
  pSVar2 = this->state_;
  if ((pSVar2->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>._M_impl.
      _M_node.super__List_node_base._M_next == (_List_node_base *)&pSVar2->calls_) {
    pcVar11 = "!state_->calls_.empty()";
  }
  else {
    p_Var3 = (pSVar2->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>.
             _M_impl._M_node.super__List_node_base._M_prev;
    if ((p_Var3[1]._M_prev != (_List_node_base *)0x0) &&
       (this_00 = (Closure *)(p_Var3[1]._M_prev)->_M_next, this_00 != (Closure *)0x0)) {
      this_01 = Closure::GetPrototype(this_00);
      uVar12 = (long)a - (long)p_Var3[1]._M_next >> 4;
      pIVar9 = (Instruction *)((long)&p_Var3[2]._M_next[-1]._M_prev + 4);
      pIVar4 = Function::GetOpCodes(this_01);
      uVar7 = (long)pIVar9 - (long)pIVar4;
      pcVar8 = "";
      pcVar11 = "?";
LAB_00168d8b:
      while( true ) {
        if (pIVar9 <= pIVar4) goto LAB_00168e6b;
        uVar1 = pIVar9[-1].opcode_;
        pIVar9 = pIVar9 + -1;
        uVar10 = uVar1 >> 0x18;
        if (uVar10 != 6) break;
        if (uVar12 == (uVar1 >> 0x10 & 0xff)) {
          pSVar5 = Function::SearchLocalVar(this_01,uVar1 >> 8 & 0xff,(int)(uVar7 >> 2));
          if (pSVar5 != (String *)0x0) {
            pcVar8 = "local";
LAB_00168e58:
            if ((pSVar5->super_GCObject).field_0x11 == '\0') {
              pcVar11 = (char *)&pSVar5->field_1;
            }
            else {
              pcVar11 = (pSVar5->field_1).str_;
            }
          }
LAB_00168e6b:
          pVar13.second = pcVar8;
          pVar13.first = pcVar11;
          return pVar13;
        }
      }
      if (uVar10 == 7) {
        if (uVar12 != (uVar1 >> 0x10 & 0xff)) goto LAB_00168d8b;
        pVVar6 = (Value *)((long)&((this_01->upvalues_).
                                   super__Vector_base<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->name_ +
                          (ulong)(uVar1 >> 4 & 0xff0));
        pcVar8 = "upvalue";
      }
      else if (uVar10 == 0x25) {
        if (uVar12 != (uVar1 & 0xff)) goto LAB_00168d8b;
        uVar7 = (ulong)(uVar1 >> 4 & 0xff0);
        pcVar8 = "table member";
        if (*(int *)((long)&(p_Var3[1]._M_next)->_M_prev + uVar7) != 4) goto LAB_00168e6b;
        pVVar6 = (Value *)((long)&(p_Var3[1]._M_next)->_M_next + uVar7);
      }
      else {
        if ((uVar10 != 9) || (uVar12 != (uVar1 >> 0x10 & 0xff))) goto LAB_00168d8b;
        pVVar6 = Function::GetConstValue(this_01,uVar1 & 0xffff);
        if (pVVar6->type_ != ValueT_String) goto LAB_00168e6b;
        pcVar8 = "global";
      }
      pSVar5 = (String *)(pVVar6->field_0).closure_;
      goto LAB_00168e58;
    }
    pcVar11 = "call->func_ && call->func_->closure_";
  }
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/VM.cpp",
                0x1ea,
                "std::pair<const char *, const char *> luna::VM::GetOperandNameAndScope(const Value *) const"
               );
}

Assistant:

std::pair<const char *, const char *> VM::GetOperandNameAndScope(const Value *a) const
    {
        GET_CALLINFO_AND_PROTO();

        auto reg = a - call->register_;
        auto instruction = call->instruction_ - 1;
        auto base = proto->GetOpCodes();
        auto pc = instruction - base;
        const char *unknown_name = "?";
        const char *scope_global = "global";
        const char *scope_local = "local";
        const char *scope_upvalue = "upvalue";
        const char *scope_table = "table member";
        const char *scope_null = "";

        // Search last instruction which dst register is reg,
        // and get the name base on the instruction
        while (instruction > base)
        {
            --instruction;
            switch (Instruction::GetOpCode(*instruction)) {
                case OpType_GetGlobal:
                    if (reg == Instruction::GetParamA(*instruction))
                    {
                        auto index = Instruction::GetParamBx(*instruction);
                        auto key = proto->GetConstValue(index);
                        if (key->type_ == ValueT_String)
                            return { key->str_->GetCStr(), scope_global };
                        else
                            return { unknown_name, scope_null };
                    }
                    break;
                case OpType_Move:
                    if (reg == Instruction::GetParamA(*instruction))
                    {
                        auto src = Instruction::GetParamB(*instruction);
                        auto name = proto->SearchLocalVar(src, pc);
                        if (name)
                            return { name->GetCStr(), scope_local };
                        else
                            return { unknown_name, scope_null };
                    }
                    break;
                case OpType_GetUpvalue:
                    if (reg == Instruction::GetParamA(*instruction))
                    {
                        auto index = Instruction::GetParamB(*instruction);
                        auto upvalue_info = proto->GetUpvalue(index);
                        return { upvalue_info->name_->GetCStr(), scope_upvalue };
                    }
                    break;
                case OpType_GetTable:
                    if (reg == Instruction::GetParamC(*instruction))
                    {
                        auto key = Instruction::GetParamB(*instruction);
                        auto key_reg = call->register_ + key;
                        if (key_reg->type_ == ValueT_String)
                            return { key_reg->str_->GetCStr(), scope_table };
                        else
                            return { unknown_name, scope_table };
                    }
                    break;
            }
        }

        return { unknown_name, scope_null };
    }